

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revert_list.cpp
# Opt level: O0

ListNode * revert_list(ListNode *head)

{
  ListNode *pLVar1;
  ListNode *next;
  ListNode *prev;
  ListNode *head_local;
  
  next = (ListNode *)0x0;
  prev = head;
  while (prev != (ListNode *)0x0) {
    pLVar1 = prev->next;
    prev->next = next;
    next = prev;
    prev = pLVar1;
  }
  return next;
}

Assistant:

ListNode* revert_list(ListNode* head)
{
	ListNode* prev = nullptr;
	ListNode* next = nullptr;

	while (head) {
		// hanle current node
		next = head->next;
		head->next = prev;

		// move to next node
		prev = head;
		head = next;
	}

	return prev;
}